

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O1

void convert_digit_sequence_for_numerical_reading(NJDNode *start,NJDNode *end)

{
  _NJDNode **pp_Var1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  NJDNode *pNVar7;
  _NJDNode *p_Var8;
  uint uVar9;
  uint uVar10;
  
  uVar4 = 0;
  p_Var8 = start;
  if (end->next != start) {
    do {
      uVar4 = uVar4 + 1;
      pp_Var1 = &p_Var8->next;
      p_Var8 = *pp_Var1;
    } while (*pp_Var1 != end->next);
  }
  if (1 < uVar4) {
    uVar10 = 4;
    if ((uVar4 & 3) != 0) {
      uVar10 = uVar4 & 3;
    }
    uVar9 = 0;
    iVar5 = uVar4 - uVar10;
    if (uVar10 <= uVar4 && iVar5 != 0) {
      iVar6 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      uVar9 = iVar6 >> 2;
    }
    if (((int)uVar9 < 0x12) && (end->next != start)) {
      iVar5 = uVar10 - 1;
      bVar3 = false;
      do {
        iVar6 = get_digit(start,0);
        if (iVar5 == 0) {
          if (iVar6 == 0) {
            NJDNode_set_pron(start,(char *)0x0);
            NJDNode_set_acc(start,0);
            NJDNode_set_mora_size(start,0);
            if (bVar3) goto LAB_001710db;
          }
          else {
LAB_001710db:
            if (0 < (int)uVar9) {
              pNVar7 = (NJDNode *)calloc(1,0x78);
              NJDNode_initialize(pNVar7);
              NJDNode_load(pNVar7,njd_set_digit_rule_numeral_list3[uVar9]);
              start = NJDNode_insert(start,start->next,pNVar7);
            }
          }
          uVar9 = uVar9 - 1;
          bVar3 = false;
        }
        else if (iVar6 < 1) {
          NJDNode_set_pron(start,(char *)0x0);
          NJDNode_set_acc(start,0);
          NJDNode_set_mora_size(start,0);
        }
        else {
          if (iVar6 == 1) {
            NJDNode_load(start,njd_set_digit_rule_numeral_list2[iVar5]);
          }
          else {
            pNVar7 = (NJDNode *)calloc(1,0x78);
            NJDNode_initialize(pNVar7);
            NJDNode_load(pNVar7,njd_set_digit_rule_numeral_list2[iVar5]);
            start = NJDNode_insert(start,start->next,pNVar7);
          }
          bVar3 = true;
        }
        bVar2 = iVar5 < 1;
        iVar5 = iVar5 + -1;
        if (bVar2) {
          iVar5 = 3;
        }
        start = start->next;
      } while (start != end->next);
    }
  }
  return;
}

Assistant:

static void convert_digit_sequence_for_numerical_reading(NJDNode * start, NJDNode * end)
{
   NJDNode *node;
   NJDNode *newnode;
   int digit;
   int place = 0;
   int index;
   int size = 0;
   int have = 0;

   for (node = start; node != end->next; node = node->next)
      size++;
   if (size <= 1)
      return;

   index = size % 4;
   if (index == 0)
      index = 4;
   if (size > index)
      place = (size - index) / 4;
   index--;
   if (place > 17)
      return;

   for (node = start; node != end->next; node = node->next) {
      digit = get_digit(node, 0);
      if (index == 0) {
         if (digit == 0) {
            NJDNode_set_pron(node, NULL);
            NJDNode_set_acc(node, 0);
            NJDNode_set_mora_size(node, 0);
         } else {
            have = 1;
         }
         if (have == 1) {
            if (place > 0) {
               newnode = (NJDNode *) calloc(1, sizeof(NJDNode));
               NJDNode_initialize(newnode);
               NJDNode_load(newnode, (char *) njd_set_digit_rule_numeral_list3[place]);
               node = NJDNode_insert(node, node->next, newnode);
            }
            have = 0;
         }
         place--;
      } else {
         if (digit <= 0) {
            NJDNode_set_pron(node, NULL);
            NJDNode_set_acc(node, 0);
            NJDNode_set_mora_size(node, 0);
         } else if (digit == 1) {
            NJDNode_load(node, (char *) njd_set_digit_rule_numeral_list2[index]);
            have = 1;
         } else {
            newnode = (NJDNode *) calloc(1, sizeof(NJDNode));
            NJDNode_initialize(newnode);
            NJDNode_load(newnode, (char *) njd_set_digit_rule_numeral_list2[index]);
            node = NJDNode_insert(node, node->next, newnode);
            have = 1;
         }
      }
      index--;
      if (index < 0)
         index = 4 - 1;
   }
}